

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O2

void Gia_ManAutomWalkOne(Gia_Man_t *p,int nSteps,Vec_Wrd_t *vStates,Vec_Int_t *vCounts,
                        Vec_Wrd_t *vTemp,word Init)

{
  int iVar1;
  int iVar2;
  int iVar3;
  word wVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  word Cur;
  long lVar8;
  uint local_270;
  uint local_26c;
  word pNext [64];
  
  iVar3 = 0;
  if (nSteps < 1) {
    nSteps = 0;
  }
  Cur = 0;
  do {
    if (iVar3 == nSteps) goto LAB_005eaee7;
    wVar4 = Gia_ManAutomStep(p,Cur,pNext,vTemp);
    iVar7 = 1000000000;
    lVar8 = 0;
    local_270 = 0xffffffff;
    local_26c = local_270;
    while( true ) {
      iVar1 = p->vCis->nSize;
      iVar2 = p->nRegs;
      if (iVar1 - iVar2 <= lVar8) break;
      if (pNext[lVar8] != Init) {
        uVar5 = (ulong)(uint)vStates->nSize;
        if (vStates->nSize < 1) {
          uVar5 = 0;
        }
        for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
          if (vStates->pArray[uVar6] == pNext[lVar8]) {
            iVar1 = Vec_IntEntry(vCounts,(int)uVar6);
            goto LAB_005ead77;
          }
        }
        iVar1 = 0;
        uVar6 = 0xffffffff;
LAB_005ead77:
        if ((iVar1 < iVar7) ||
           ((iVar1 != 0 && iVar7 != 1000000000 &&
            (iVar2 = rand(), (float)iVar2 * 4.656613e-10 < (float)iVar7 / (float)iVar1)))) {
          local_26c = (uint)lVar8;
          local_270 = (uint)uVar6;
          iVar7 = iVar1;
        }
        if (iVar7 == 0) {
          if (local_270 == 0xffffffff) goto LAB_005eae30;
          goto LAB_005eae4e;
        }
      }
      lVar8 = lVar8 + 1;
    }
    if (iVar7 == 1000000000) {
      for (lVar8 = 0; lVar8 < iVar1 - iVar2; lVar8 = lVar8 + 1) {
        if ((long)(wVar4 << ((byte)lVar8 & 0x3f)) < 0) {
          putchar((int)lVar8 + 0x61);
          putchar(0x21);
          iVar2 = p->nRegs;
          iVar1 = p->vCis->nSize;
        }
      }
LAB_005eaee7:
      putchar(10);
      return;
    }
    if (999999999 < iVar7) {
      __assert_fail("CountMin < ABC_INFINITY",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaRex.c"
                    ,0x1c5,
                    "void Gia_ManAutomWalkOne(Gia_Man_t *, int, Vec_Wrd_t *, Vec_Int_t *, Vec_Wrd_t *, word)"
                   );
    }
    if (local_270 == 0xffffffff) {
      if (iVar7 != 0) {
        __assert_fail("CountMin == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaRex.c"
                      ,0x1c8,
                      "void Gia_ManAutomWalkOne(Gia_Man_t *, int, Vec_Wrd_t *, Vec_Int_t *, Vec_Wrd_t *, word)"
                     );
      }
LAB_005eae30:
      local_270 = vCounts->nSize;
      Vec_IntPush(vCounts,0);
      Vec_WrdPush(vStates,pNext[(int)local_26c]);
    }
LAB_005eae4e:
    if (((int)local_270 < 0) || (vCounts->nSize <= (int)local_270)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
    }
    vCounts->pArray[local_270] = vCounts->pArray[local_270] + 1;
    Cur = pNext[(int)local_26c];
    putchar(local_26c + 0x61);
    if ((wVar4 >> ((ulong)(byte)(0x3f - (char)local_26c) & 0x3f) & 1) != 0) {
      putchar(0x21);
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void Gia_ManAutomWalkOne( Gia_Man_t * p, int nSteps, Vec_Wrd_t * vStates, Vec_Int_t * vCounts, Vec_Wrd_t * vTemp, word Init )
{
    word iState = 0, Output, pNext[64]; 
    int i, k, kMin, Index, IndexMin;
    int Count, CountMin; 
    for ( i = 0; i < nSteps; i++ )
    {
        Output = Gia_ManAutomStep( p, iState, pNext, vTemp );
        // check visited states
        kMin = -1;
        IndexMin = -1;
        CountMin = ABC_INFINITY;  
        for ( k = 0; k < Gia_ManPiNum(p); k++ )
        {
            if ( pNext[k] == Init )
                continue;
            Index = Vec_WrdFind( vStates, pNext[k] );
            Count = Index == -1 ? 0 : Vec_IntEntry( vCounts, Index );
            if ( CountMin > Count || (CountMin != ABC_INFINITY && Count && ((float)CountMin / Count) > (float)rand()/RAND_MAX ) )
            {
                CountMin = Count;
                IndexMin = Index;
                kMin = k;
            }
            if ( CountMin == 0 )
                break;
        }
        // choose the best state
        if ( CountMin == ABC_INFINITY )
        {
            for ( k = 0; k < Gia_ManPiNum(p); k++ )
                if ( (Output >> (63-k)) & 1 )
                {
                    printf( "%c", 'a' + k );
                    printf( "!" );
                }            
            break;
        }
        assert( CountMin < ABC_INFINITY );
        if ( IndexMin == -1 )
        {
            assert( CountMin == 0 );
            IndexMin = Vec_IntSize(vCounts);
            Vec_IntPush( vCounts, 0 );
            Vec_WrdPush( vStates, pNext[kMin] );
        }
        Vec_IntAddToEntry( vCounts, IndexMin, 1 );
        iState = pNext[kMin];
//Extra_PrintBinary( stdout, (unsigned *)&iState, 64 ); printf( "\n" );
        // print the transition
        printf( "%c", 'a' + kMin );
        if ( (Output >> (63-kMin)) & 1 )
            printf( "!" );
    }
    printf( "\n" );
}